

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::operator()(Builder *this,VarDeclStmt *node)

{
  FunctionModule *pFVar1;
  element_type *peVar2;
  pointer pcVar3;
  BuilderContext *pBVar4;
  BBLIter bblIter;
  element_type *peVar5;
  bool bVar6;
  __node_base _Var7;
  string name;
  shared_ptr<mocker::ir::Reg> valPtr;
  shared_ptr<mocker::ir::Reg> local_120;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  BBLIter local_f0;
  size_type local_e8;
  _List_node_base local_e0;
  shared_ptr<mocker::ir::Reg> local_d0;
  __node_base *local_c0 [2];
  __node_base local_b0 [2];
  __node_base local_a0;
  __node_base local_90 [2];
  _Hash_node_base *local_80 [2];
  _Hash_node_base local_70 [2];
  shared_ptr<mocker::ir::Label> *local_60 [2];
  shared_ptr<mocker::ir::Label> local_50;
  shared_ptr<mocker::ir::IRInst> local_40;
  
  pFVar1 = this->ctx->curFunc;
  peVar2 = (node->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->val)._M_dataplus._M_p;
  local_f0._M_node = &local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + (peVar2->val)._M_string_length);
  local_60[0] = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,local_f0._M_node,(long)&(local_f0._M_node)->_M_next + local_e8);
  makeReg((Builder *)&local_d0,(string *)this);
  if (local_60[0] != &local_50) {
    operator_delete(local_60[0],
                    (ulong)((long)&((local_50.
                                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Addr)._vptr_Addr + 1));
  }
  pBVar4 = this->ctx;
  bblIter._M_node =
       (pFVar1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  local_110._0_8_ = (Alloca *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8),(Alloca **)local_110,
             (allocator<mocker::ir::Alloca> *)&local_120,&local_d0);
  local_40.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_110._0_8_;
  local_40.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_;
  local_110._0_8_ = (Alloca *)0x0;
  local_110._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInstFront(pBVar4,bblIter,&local_40);
  if (local_40.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
  }
  if ((node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    bVar6 = false;
  }
  else {
    BuilderContext::getExprType((BuilderContext *)local_110,(NodeID)this->ctx);
    bVar6 = isNullTy(this,(shared_ptr<mocker::ast::Type> *)local_110);
    bVar6 = !bVar6;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
  }
  if (bVar6) {
    peVar5 = (node->initExpr).
             super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar5->super_ASTNode)._vptr_ASTNode[3])
              (peVar5,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    pBVar4 = this->ctx;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,local_f0._M_node,(long)&(local_f0._M_node)->_M_next + local_e8);
    makeReg((Builder *)&local_120,(string *)this);
    BuilderContext::getExprAddr((BuilderContext *)local_100,(NodeID)this->ctx);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
              (pBVar4,&local_120,(shared_ptr<mocker::ir::Addr> *)local_100);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    if (local_120.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_90[0]._M_nxt = local_70[0]._M_nxt;
    _Var7._M_nxt = local_80[0];
    if (local_80[0] == local_70) goto LAB_001419d7;
  }
  else {
    bVar6 = isBoolTy(this,&node->type);
    if ((bVar6) || (bVar6 = isIntTy(this,&node->type), bVar6)) goto LAB_001419d7;
    pBVar4 = this->ctx;
    local_a0._M_nxt = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_f0._M_node,(long)&(local_f0._M_node)->_M_next + local_e8);
    makeReg((Builder *)&local_120,(string *)this);
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"@null","");
    makeReg((Builder *)local_100,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>>
              (pBVar4,&local_120,(shared_ptr<mocker::ir::Reg> *)local_100);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],(ulong)((long)&(local_b0[0]._M_nxt)->_M_nxt + 1));
    }
    if (local_120.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var7._M_nxt = local_a0._M_nxt;
    if (local_a0._M_nxt == local_90) goto LAB_001419d7;
  }
  operator_delete(_Var7._M_nxt,(ulong)((long)&(local_90[0]._M_nxt)->_M_nxt + 1));
LAB_001419d7:
  if (local_d0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f0._M_node != &local_e0) {
    operator_delete(local_f0._M_node,(ulong)((long)&(local_e0._M_next)->_M_next + 1));
  }
  return;
}

Assistant:

void Builder::operator()(const ast::VarDeclStmt &node) const {
  auto &func = ctx.getCurFunc();
  auto name = node.identifier->val;
  auto valPtr = makeReg(name);
  ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(valPtr));

  if (node.initExpr && !isNullTy(ctx.getExprType(node.initExpr->getID()))) {
    visit(*node.initExpr);
    ctx.emplaceInst<Store>(makeReg(name),
                           ctx.getExprAddr(node.initExpr->getID()));
    return;
  }
  if (isBoolTy(node.type) || isIntTy(node.type)) {
    return;
  }
  ctx.emplaceInst<Store>(makeReg(name), makeReg("@null"));
}